

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall tinyusdz::Property::set_attribute(Property *this,Attribute *attrib)

{
  Attribute *attrib_local;
  Property *this_local;
  
  Attribute::operator=(&this->_attrib,attrib);
  this->_type = Attrib;
  return;
}

Assistant:

void set_attribute(const Attribute &attrib) {
    _attrib = attrib;
    _type = Type::Attrib;
  }